

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_shader.cpp
# Opt level: O1

void draw_line(float *line_dir,float radius,float *dot_dir,float *c)

{
  int i;
  long lVar1;
  float fVar2;
  float p;
  float fVar3;
  vec2 line_perp;
  float local_10 [2];
  
  local_10[0] = -line_dir[1];
  local_10[1] = *line_dir;
  fVar3 = 0.0;
  lVar1 = 0;
  do {
    fVar3 = fVar3 + local_10[lVar1] * dot_dir[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  if (0.0 <= fVar3) {
    fVar2 = floorf(radius / ((1.0 - *c) * 3.0 * 100.0));
    fVar2 = fmodf(fVar3,fVar2);
    if (fVar2 < 0.1) {
      lVar1 = 0;
      do {
        c[lVar1] = c[lVar1] * 0.0;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
      return;
    }
  }
  if (fVar3 < 0.0) {
    fVar2 = floorf(radius / ((1.0 - *c) * 3.0 * 100.0));
    fVar3 = fmodf(fVar3,fVar2);
    if (-0.1 < fVar3) {
      lVar1 = 0;
      do {
        c[lVar1] = c[lVar1] * 0.0;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
      return;
    }
  }
  c[0] = 1.0;
  c[1] = 1.0;
  c[2] = 1.0;
  return;
}

Assistant:

void draw_line(const vec2 line_dir, const float radius, const vec2 dot_dir, vec3 c){
    vec2 line_perp = {-1*line_dir[1], line_dir[0]};
    float dp = vec2_mul_inner(dot_dir, line_perp);
    if(dp >= 0 && fmod(dp, floor(radius/((1-c[0])*3*100))) < 0.1f){
        vec3_scale(c, c, 0.0f);
    }
    else if(dp < 0 && fmod(dp, floor(radius/((1-c[0])*3*100))) > -0.1f){
        vec3_scale(c, c, 0.0f);
    }
    else {
        c[0] = 1.0f;
        c[1] = 1.0f;
        c[2] = 1.0f;
    }
}